

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID ImGui::AddContextHook(ImGuiContext *ctx,ImGuiContextHook *hook)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  ImGuiContextHook *pIVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ImGuiID IVar8;
  ImGuiContextHook *pIVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  
  if (((*(long *)(hook + 0x10) == 0) || (*(int *)hook != 0)) || (*(int *)(hook + 4) == 7)) {
    __assert_fail("hook->Callback != __null && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0xd5c,"ImGuiID ImGui::AddContextHook(ImGuiContext *, const ImGuiContextHook *)");
  }
  iVar12 = (ctx->Hooks).Size;
  iVar3 = (ctx->Hooks).Capacity;
  if (iVar12 == iVar3) {
    iVar12 = iVar12 + 1;
    if (iVar3 == 0) {
      iVar10 = 8;
    }
    else {
      iVar10 = iVar3 / 2 + iVar3;
    }
    if (iVar12 < iVar10) {
      iVar12 = iVar10;
    }
    if (iVar3 < iVar12) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar2 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar2 = *piVar2 + 1;
      }
      pIVar9 = (ImGuiContextHook *)(*GImAllocatorAllocFunc)((long)iVar12 << 5,GImAllocatorUserData);
      pIVar4 = (ctx->Hooks).Data;
      if (pIVar4 != (ImGuiContextHook *)0x0) {
        memcpy(pIVar9,pIVar4,(long)(ctx->Hooks).Size << 5);
        pIVar4 = (ctx->Hooks).Data;
        if ((pIVar4 != (ImGuiContextHook *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar2 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar2 = *piVar2 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar4,GImAllocatorUserData);
      }
      (ctx->Hooks).Data = pIVar9;
      (ctx->Hooks).Capacity = iVar12;
    }
  }
  pIVar4 = (ctx->Hooks).Data;
  lVar11 = (long)(ctx->Hooks).Size * 0x20;
  uVar5 = *(undefined8 *)hook;
  uVar6 = *(undefined8 *)(hook + 8);
  uVar7 = *(undefined8 *)(hook + 0x18);
  pIVar9 = pIVar4 + lVar11 + 0x10;
  *(undefined8 *)pIVar9 = *(undefined8 *)(hook + 0x10);
  *(undefined8 *)(pIVar9 + 8) = uVar7;
  pIVar4 = pIVar4 + lVar11;
  *(undefined8 *)pIVar4 = uVar5;
  *(undefined8 *)(pIVar4 + 8) = uVar6;
  iVar12 = (ctx->Hooks).Size;
  IVar8 = ctx->HookIdNext;
  uVar1 = iVar12 + 1;
  (ctx->Hooks).Size = uVar1;
  IVar8 = IVar8 + 1;
  ctx->HookIdNext = IVar8;
  if (-1 < iVar12) {
    *(ImGuiID *)((ctx->Hooks).Data + (ulong)uVar1 * 0x20 + -0x20) = IVar8;
    return IVar8;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x695,"T &ImVector<ImGuiContextHook>::back() [T = ImGuiContextHook]");
}

Assistant:

ImGuiID ImGui::AddContextHook(ImGuiContext* ctx, const ImGuiContextHook* hook)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(hook->Callback != NULL && hook->HookId == 0 && hook->Type != ImGuiContextHookType_PendingRemoval_);
    g.Hooks.push_back(*hook);
    g.Hooks.back().HookId = ++g.HookIdNext;
    return g.HookIdNext;
}